

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.h
# Opt level: O0

GetblockResponse * __thiscall Future<GetblockResponse>::get(Future<GetblockResponse> *this)

{
  bool bVar1;
  element_type *peVar2;
  long in_RSI;
  GetblockResponse *in_RDI;
  GetblockResponse *in_stack_ffffffffffffff68;
  GetblockResponse *this_00;
  GetblockResponse local_68;
  
  this_00 = in_RDI;
  if (((*(byte *)(in_RSI + 0x70) & 1) == 0) &&
     (bVar1 = std::operator!=((shared_ptr<AsyncTask<GetblockResponse>_> *)in_RDI,
                              in_stack_ffffffffffffff68), bVar1)) {
    peVar2 = std::
             __shared_ptr_access<AsyncTask<GetblockResponse>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<AsyncTask<GetblockResponse>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x15ff4d);
    in_stack_ffffffffffffff68 = &local_68;
    (**peVar2->_vptr_AsyncTask)();
    GetblockResponse::operator=(this_00,in_stack_ffffffffffffff68);
    GetblockResponse::~GetblockResponse(this_00);
    *(undefined1 *)(in_RSI + 0x70) = 1;
  }
  GetblockResponse::GetblockResponse(this_00,in_stack_ffffffffffffff68);
  return in_RDI;
}

Assistant:

virtual T get() {
    if (!is_done_ && task_ != nullptr) {
      result_ = task_->get();
      is_done_ = true;
    }
    return result_;
  }